

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

void __thiscall cfd::core::Psbt::SetGlobalXpubkey(Psbt *this,KeyData *key)

{
  bool bVar1;
  undefined8 uVar2;
  string *message;
  size_type sVar3;
  uchar *buffer;
  reference puVar4;
  ExtPubkey *in_stack_fffffffffffffd70;
  string *in_stack_fffffffffffffd80;
  undefined8 in_stack_fffffffffffffd88;
  CfdError error_code;
  char *pcVar5;
  CfdException *in_stack_fffffffffffffd90;
  CfdException *this_00;
  ByteData local_250;
  uint32_t local_234;
  iterator iStack_230;
  uint child_num;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  Serializer builder;
  string local_1e8 [32];
  CfdSourceLocation local_1c8;
  undefined1 local_1b0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> num_list;
  undefined1 local_180 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> fingerprint;
  ByteData local_f8;
  undefined1 local_e0 [8];
  ByteData key_data;
  ByteData key_top;
  string local_a8 [5];
  uint8_t xpub_key;
  CfdSourceLocation local_88;
  undefined1 local_6d;
  allocator local_59;
  string local_58 [32];
  CfdSourceLocation local_38;
  void *local_20;
  wally_psbt *psbt_pointer;
  KeyData *key_local;
  Psbt *this_local;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  local_20 = this->wally_psbt_pointer_;
  psbt_pointer = (wally_psbt *)key;
  key_local = (KeyData *)this;
  if (local_20 == (void *)0x0) {
    local_38.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_38.filename = local_38.filename + 1;
    local_38.line = 0xc5a;
    local_38.funcname = "SetGlobalXpubkey";
    logger::warn<>(&local_38,"psbt pointer is null");
    local_6d = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_58,"psbt pointer is null.",&local_59);
    CfdException::CfdException(in_stack_fffffffffffffd90,error_code,in_stack_fffffffffffffd80);
    local_6d = 0;
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar1 = KeyData::HasExtPubkey(key);
  if (!bVar1) {
    local_88.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_88.filename = local_88.filename + 1;
    local_88.line = 0xc5f;
    local_88.funcname = "SetGlobalXpubkey";
    pcVar5 = "psbt global xpub can set only ExtPubkey.";
    logger::warn<>(&local_88,"psbt global xpub can set only ExtPubkey.");
    key_top.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    message = (string *)__cxa_allocate_exception(0x30);
    this_00 = (CfdException *)
              ((long)&key_top.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 7);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_a8,pcVar5,(allocator *)this_00);
    CfdException::CfdException(this_00,(CfdError)((ulong)pcVar5 >> 0x20),message);
    key_top.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(message,&CfdException::typeinfo,CfdException::~CfdException);
  }
  key_top.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
  ByteData::ByteData((ByteData *)
                     &key_data.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     (uint8_t *)
                     ((long)&key_top.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 5),1);
  KeyData::GetExtPubkey
            ((ExtPubkey *)
             &fingerprint.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(KeyData *)psbt_pointer);
  ExtPubkey::GetData(&local_f8,
                     (ExtPubkey *)
                     &fingerprint.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  ByteData::Concat<cfd::core::ByteData>
            ((ByteData *)local_e0,
             (ByteData *)
             &key_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_f8);
  ByteData::~ByteData((ByteData *)0x47f62d);
  ExtPubkey::~ExtPubkey(in_stack_fffffffffffffd70);
  KeyData::GetFingerprint
            ((ByteData *)
             &num_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(KeyData *)psbt_pointer);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_180,
                     (ByteData *)
                     &num_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  ByteData::~ByteData((ByteData *)0x47f66c);
  KeyData::GetChildNumArray
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1b0,
             (KeyData *)psbt_pointer);
  sVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_180);
  if (sVar3 < 4) {
    local_1c8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_1c8.filename = local_1c8.filename + 1;
    local_1c8.line = 0xc6a;
    local_1c8.funcname = "SetGlobalXpubkey";
    logger::warn<>(&local_1c8,"psbt fingerprint size low 4 byte.");
    builder._38_1_ = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_1e8,"psbt fingerprint size low 4 byte.",(allocator *)&builder.field_0x27);
    CfdException::CfdException(in_stack_fffffffffffffd90,error_code,in_stack_fffffffffffffd80);
    builder._38_1_ = 0;
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  sVar3 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1b0);
  Serializer::Serializer((Serializer *)&__range2,(int)sVar3 * 4 + 4);
  buffer = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x47f87a);
  Serializer::AddDirectBytes((Serializer *)&__range2,buffer,4);
  __end2 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1b0);
  iStack_230 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1b0);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffdd0);
    if (!bVar1) break;
    puVar4 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    local_234 = *puVar4;
    Serializer::AddDirectNumber((Serializer *)&__range2,local_234);
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end2);
  }
  Serializer::Output(&local_250,(Serializer *)&__range2);
  SetGlobalRecord(this,(ByteData *)local_e0,&local_250);
  ByteData::~ByteData((ByteData *)0x47f963);
  Serializer::~Serializer((Serializer *)&__range2);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd80);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd80);
  ByteData::~ByteData((ByteData *)0x47f993);
  ByteData::~ByteData((ByteData *)0x47f99f);
  return;
}

Assistant:

void Psbt::SetGlobalXpubkey(const KeyData &key) {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  if (psbt_pointer == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt pointer is null");
    throw CfdException(kCfdIllegalStateError, "psbt pointer is null.");
  }

  if (!key.HasExtPubkey()) {
    warn(CFD_LOG_SOURCE, "psbt global xpub can set only ExtPubkey.");
    throw CfdException(
        kCfdIllegalArgumentError, "psbt global xpub can set only ExtPubkey.");
  }
  uint8_t xpub_key = Psbt::kPsbtGlobalXpub;
  ByteData key_top(&xpub_key, 1);
  ByteData key_data = key_top.Concat(key.GetExtPubkey().GetData());

  auto fingerprint = key.GetFingerprint().GetBytes();
  auto num_list = key.GetChildNumArray();
  if (fingerprint.size() < 4) {
    warn(CFD_LOG_SOURCE, "psbt fingerprint size low 4 byte.");
    throw CfdException(
        kCfdIllegalArgumentError, "psbt fingerprint size low 4 byte.");
  }
  // if (num_list.empty()) {
  //   warn(CFD_LOG_SOURCE, "psbt empty bip32 path.");
  //   throw CfdException(kCfdIllegalArgumentError, "psbt empty bip32 path.");
  // }
  Serializer builder(4 + (static_cast<uint32_t>(num_list.size()) * 4));
  builder.AddDirectBytes(fingerprint.data(), 4);
  for (const auto child_num : num_list) {
    builder.AddDirectNumber(child_num);
  }
  SetGlobalRecord(key_data, builder.Output());
}